

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::FatalConditionHandler::FatalConditionHandler(FatalConditionHandler *this)

{
  ulong uVar1;
  void *__s;
  
  this->m_started = false;
  if (altStackMem != (void *)0x0) {
    __assert_fail("!altStackMem && \"Cannot initialize POSIX signal handler when one already exists\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/csguth[P]Liberty/build_O2/_deps/catch2-src/single_include/catch2/catch.hpp"
                  ,0x2aac,"Catch::FatalConditionHandler::FatalConditionHandler()");
  }
  if (altStackSize == 0) {
    uVar1 = sysconf(0xfa);
    altStackSize = 0x8000;
    if (0x8000 < uVar1) {
      altStackSize = uVar1;
    }
  }
  uVar1 = altStackSize;
  __s = operator_new__(altStackSize);
  memset(__s,0,uVar1);
  altStackMem = __s;
  return;
}

Assistant:

FatalConditionHandler::FatalConditionHandler() {
        assert(!altStackMem && "Cannot initialize POSIX signal handler when one already exists");
        if (altStackSize == 0) {
            altStackSize = std::max(static_cast<size_t>(SIGSTKSZ), minStackSizeForErrors);
        }
        altStackMem = new char[altStackSize]();
    }